

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

BigInt * __thiscall BigInt::operator+(BigInt *__return_storage_ptr__,BigInt *this,BigInt *that)

{
  pointer plVar1;
  bool bVar2;
  pointer plVar3;
  pointer plVar4;
  ulong uVar5;
  long lVar6;
  BigInt *res;
  ulong uVar7;
  ulong uVar8;
  longlong lVar9;
  ulong uVar10;
  BigInt local_50;
  
  if (this->sign == that->sign) {
    BigInt(__return_storage_ptr__,that);
    plVar3 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar4 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar10 = 0;
    uVar7 = 0;
    while( true ) {
      uVar5 = (long)plVar4 - (long)plVar3;
      uVar8 = (long)(that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      if (uVar8 < (ulong)((long)uVar5 >> 3)) {
        uVar8 = (long)uVar5 >> 3;
      }
      if (((int)uVar7 == 0) && ((long)(int)uVar8 <= (long)uVar10)) break;
      if (uVar10 == ((ulong)((long)(__return_storage_ptr__->vector_value).
                                   super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)(__return_storage_ptr__->vector_value).
                                  super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3 & 0xffffffff)) {
        local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
                  (&__return_storage_ptr__->vector_value,(longlong *)&local_50);
        plVar3 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        plVar4 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar5 = (long)plVar4 - (long)plVar3;
      }
      if ((long)uVar10 < (long)(int)(uVar5 >> 3)) {
        lVar9 = plVar3[uVar10];
      }
      else {
        lVar9 = 0;
      }
      plVar1 = (__return_storage_ptr__->vector_value).
               super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = uVar7 + lVar9 + plVar1[uVar10];
      plVar1[uVar10] = lVar6;
      bVar2 = base <= lVar6;
      if (base <= lVar6) {
        plVar1[uVar10] = lVar6 - base;
      }
      uVar7 = (ulong)bVar2;
      uVar10 = uVar10 + 1;
    }
  }
  else {
    operator-(&local_50,that);
    operator-(__return_storage_ptr__,this,&local_50);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator+(const BigInt &that) const { //! addition operator overloading
        if (sign == that.sign) {
            BigInt res = that; //! initialize with THAT, even both are negatives this will work

            //! keep looping for all digits until exhausted considering the carry (go from the least significant digit)
            for (int i = 0, carry = 0; i < (int) max(vector_value.size(), that.vector_value.size()) || carry; ++i) {

                if (i == (int) res.vector_value.size())
                    res.vector_value.push_back(0); //! due to carry the result may be n+1

                //! accumulate to this digit
                res.vector_value[i] += carry + (i < (int) vector_value.size() ? vector_value[i] : 0);

                //! make a carry to the next digit if sum can't fit in this digit
                //! same as carry = sum / base
                carry = res.vector_value[i] >= base;

                if (carry)
                    res.vector_value[i] -= base; //!keep only the remainder = sum % base
            }

            return res;
        }

        //! A+B have different signs represent them as difference
        return *this - (-that);
    }